

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O2

int omp_target_is_present(void *ptr,int device_num)

{
  long lVar1;
  void *pvVar2;
  uint uVar3;
  bool IsLast;
  
  uVar3 = 0;
  if (ptr != (void *)0x0) {
    if (device_num == -10) {
      uVar3 = 1;
    }
    else {
      std::mutex::lock(&RTLsMtx);
      lVar1 = (long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                    super__Vector_impl_data._M_start;
      pthread_mutex_unlock((pthread_mutex_t *)&RTLsMtx);
      uVar3 = 0;
      if ((ulong)(long)device_num < (ulong)(lVar1 / 0x118)) {
        pvVar2 = DeviceTy::getTgtPtrBegin
                           (Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                            super__Vector_impl_data._M_start + device_num,ptr,0,&IsLast,false);
        uVar3 = (uint)(pvVar2 != (void *)0x0);
      }
    }
  }
  return uVar3;
}

Assistant:

EXTERN int omp_target_is_present(void *ptr, int device_num) {
  DP("Call to omp_target_is_present for device %d and address " DPxMOD "\n",
      device_num, DPxPTR(ptr));

  if (!ptr) {
    DP("Call to omp_target_is_present with NULL ptr, returning false\n");
    return false;
  }

  if (device_num == omp_get_initial_device()) {
    DP("Call to omp_target_is_present on host, returning true\n");
    return true;
  }

  RTLsMtx.lock();
  size_t Devices_size = Devices.size();
  RTLsMtx.unlock();
  if (Devices_size <= (size_t)device_num) {
    DP("Call to omp_target_is_present with invalid device ID, returning "
        "false\n");
    return false;
  }

  DeviceTy& Device = Devices[device_num];
  bool IsLast; // not used
  int rc = (Device.getTgtPtrBegin(ptr, 0, IsLast, false) != NULL);
  DP("Call to omp_target_is_present returns %d\n", rc);
  return rc;
}